

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MPP_RET mpp_buffer_group_set_callback(MppBufferGroupImpl *p,MppBufCallback callback,void *arg)

{
  void *arg_local;
  MppBufCallback callback_local;
  MppBufferGroupImpl *p_local;
  
  if (p != (MppBufferGroupImpl *)0x0) {
    if ((mpp_buffer_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_group_set_callback");
    }
    p->arg = arg;
    p->callback = callback;
    if ((mpp_buffer_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_group_set_callback");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_buffer_group_set_callback(MppBufferGroupImpl *p,
                                      MppBufCallback callback, void *arg)
{
    if (!p)
        return MPP_OK;

    MPP_BUF_FUNCTION_ENTER();

    p->arg      = arg;
    p->callback = callback;

    MPP_BUF_FUNCTION_LEAVE();
    return MPP_OK;
}